

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search_fwdtree.c
# Opt level: O0

int ngram_fwdtree_search(ngram_search_t *ngs,int frame_idx)

{
  int16 *senone_scores;
  int16 *senscr;
  ngram_search_t *pnStack_18;
  int frame_idx_local;
  ngram_search_t *ngs_local;
  
  senscr._4_4_ = frame_idx;
  pnStack_18 = ngs;
  if (((ngs->base).acmod)->compallsen == '\0') {
    compute_sen_active(ngs,frame_idx);
  }
  senone_scores = acmod_score((pnStack_18->base).acmod,(int *)((long)&senscr + 4));
  if (senone_scores == (int16 *)0x0) {
    ngs_local._4_4_ = 0;
  }
  else {
    (pnStack_18->st).n_senone_active_utt =
         ((pnStack_18->base).acmod)->n_senone_active + (pnStack_18->st).n_senone_active_utt;
    ngram_search_mark_bptable(pnStack_18,senscr._4_4_);
    if ((pnStack_18->best_score == -0x20000000) || (pnStack_18->best_score < -0x20000000)) {
      ngs_local._4_4_ = 0;
    }
    else {
      if (pnStack_18->best_score + pnStack_18->beam * 2 < -0x20000000) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                ,0x5c5,"Renormalizing Scores at frame %d, best score %d\n",(ulong)senscr._4_4_,
                (ulong)(uint)pnStack_18->best_score);
        renormalize_scores(pnStack_18,senscr._4_4_,pnStack_18->best_score);
      }
      evaluate_channels(pnStack_18,senone_scores,senscr._4_4_);
      prune_channels(pnStack_18,senscr._4_4_);
      bptable_maxwpf(pnStack_18,senscr._4_4_);
      word_transition(pnStack_18,senscr._4_4_);
      deactivate_channels(pnStack_18,senscr._4_4_);
      pnStack_18->n_frame = pnStack_18->n_frame + 1;
      ngs_local._4_4_ = 1;
    }
  }
  return ngs_local._4_4_;
}

Assistant:

int
ngram_fwdtree_search(ngram_search_t *ngs, int frame_idx)
{
    int16 const *senscr;

    /* Activate our HMMs for the current frame if need be. */
    if (!ps_search_acmod(ngs)->compallsen)
        compute_sen_active(ngs, frame_idx);

    /* Compute GMM scores for the current frame. */
    if ((senscr = acmod_score(ps_search_acmod(ngs), &frame_idx)) == NULL)
        return 0;
    ngs->st.n_senone_active_utt += ps_search_acmod(ngs)->n_senone_active;

    /* Mark backpointer table for current frame. */
    ngram_search_mark_bptable(ngs, frame_idx);

    /* If the best score is equal to or worse than WORST_SCORE,
     * recognition has failed, don't bother to keep trying. */
    if (ngs->best_score == WORST_SCORE || ngs->best_score WORSE_THAN WORST_SCORE)
        return 0;
    /* Renormalize if necessary */
    if (ngs->best_score + (2 * ngs->beam) WORSE_THAN WORST_SCORE) {
        E_INFO("Renormalizing Scores at frame %d, best score %d\n",
               frame_idx, ngs->best_score);
        renormalize_scores(ngs, frame_idx, ngs->best_score);
    }

    /* Evaluate HMMs */
    evaluate_channels(ngs, senscr, frame_idx);
    /* Prune HMMs and do phone transitions. */
    prune_channels(ngs, frame_idx);
    /* Do absolute pruning on word exits. */
    bptable_maxwpf(ngs, frame_idx);
    /* Do word transitions. */
    word_transition(ngs, frame_idx);
    /* Deactivate pruned HMMs. */
    deactivate_channels(ngs, frame_idx);

    ++ngs->n_frame;
    /* Return the number of frames processed. */
    return 1;
}